

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

int __thiscall QCss::ValueExtractor::lengthValue(ValueExtractor *this,Declaration *decl)

{
  bool bVar1;
  DeclarationData *pDVar2;
  qsizetype qVar3;
  LengthData *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  LengthData data;
  qsizetype in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_4c;
  Value *v;
  ValueExtractor *in_stack_ffffffffffffffc8;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2d944);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2d960);
    qvariant_cast<QCss::LengthData>((QVariant *)in_RSI);
    local_4c = lengthValueFromData(in_RSI,in_RDI);
  }
  else {
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2d99c
                       );
    qVar3 = QList<QCss::Value>::size(&pDVar2->values);
    if (qVar3 < 1) {
      local_4c = 0;
    }
    else {
      v = (Value *)&DAT_aaaaaaaaaaaaaaaa;
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2d9dd);
      QList<QCss::Value>::at
                ((QList<QCss::Value> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                 ,in_stack_ffffffffffffff88);
      lengthValue(in_stack_ffffffffffffffc8,v);
      ::QVariant::fromValue<QCss::LengthData>((LengthData *)in_RDI);
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2da1d);
      ::QVariant::operator=
                ((QVariant *)in_RDI,
                 (QVariant *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      ::QVariant::~QVariant(&local_28);
      local_4c = lengthValueFromData(in_RSI,in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_4c;
  }
  __stack_chk_fail();
}

Assistant:

int ValueExtractor::lengthValue(const Declaration &decl)
{
    if (decl.d->parsed.isValid())
        return  lengthValueFromData(qvariant_cast<LengthData>(decl.d->parsed), f);
    if (decl.d->values.size() < 1)
        return 0;
    LengthData data = lengthValue(decl.d->values.at(0));
    decl.d->parsed = QVariant::fromValue<LengthData>(data);
    return lengthValueFromData(data,f);
}